

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

bool __thiscall CP::queue<int>::operator==(queue<int> *this,queue<int> *o)

{
  size_t sVar1;
  size_t sVar2;
  int local_24;
  int i;
  queue<int> *o_local;
  queue<int> *this_local;
  
  sVar1 = size(this);
  sVar2 = size(o);
  if (sVar1 == sVar2) {
    for (local_24 = 0; (ulong)(long)local_24 < this->mSize; local_24 = local_24 + 1) {
      if (this->mData[(this->mFront + (long)local_24) % this->mCap] !=
          o->mData[(o->mFront + (long)local_24) % o->mCap]) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CP::queue<T>::operator==(const CP::queue<T> &o) const {
    if (size() != o.size())
        return 0;
    for (int i = 0; i < mSize; ++i) {
        if (mData[(mFront + i) % mCap] != o.mData[(o.mFront + i) % o.mCap])
            return 0;
    }
    return 1;
}